

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::AdvancedIterations::Run(AdvancedIterations *this)

{
  CallLogWrapper *this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  GLuint GVar5;
  GLuint shader;
  uint *puVar6;
  int i;
  uint uVar7;
  long lVar8;
  int i_4;
  int i_1;
  long lVar9;
  char *glsl_fs;
  char *glsl_vs;
  IVec4 zero;
  uint local_88 [4];
  uint local_78 [4];
  uint local_68 [4];
  char *local_58;
  char *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_50 = 
  "#version 310 es\nin ivec4 vs_in_data;\nflat out ivec4 data;\nvoid main() {\n  data = vs_in_data + 1;\n}"
  ;
  local_58 = 
  "#version 310 es\nprecision mediump float;\nflat in ivec4 data;\nout vec4 fs_out_color;\nvoid main() {\n  fs_out_color = vec4(data);\n}"
  ;
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  GVar5 = glu::CallLogWrapper::glCreateProgram(this_00);
  this->m_po = GVar5;
  GVar5 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  uVar7 = 0;
  glu::CallLogWrapper::glShaderSource(this_00,GVar5,1,&local_50,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource(this_00,shader,1,&local_58,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,GVar5);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  glu::CallLogWrapper::glAttachShader(this_00,this->m_po,GVar5);
  glu::CallLogWrapper::glAttachShader(this_00,this->m_po,shader);
  glu::CallLogWrapper::glDeleteShader(this_00,GVar5);
  glu::CallLogWrapper::glDeleteShader(this_00,shader);
  bVar4 = RelinkProgram(this,1);
  lVar9 = -1;
  if (bVar4) {
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_buffer[0]);
    local_48 = 0;
    uStack_40 = 0;
    glu::CallLogWrapper::glBufferData(this_00,0x8892,0x10,&local_48,0x88e4);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,this->m_buffer[1]);
    glu::CallLogWrapper::glBufferData(this_00,0x8c8e,0x10,&local_48,0x88e9);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,0);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[0]);
    glu::CallLogWrapper::glVertexAttribIFormat(this_00,1,4,0x1404,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
    glu::CallLogWrapper::glBindVertexBuffer(this_00,1,this->m_buffer[0],0,0x10);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[1]);
    glu::CallLogWrapper::glVertexAttribIFormat(this_00,1,4,0x1404,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
    glu::CallLogWrapper::glBindVertexBuffer(this_00,1,this->m_buffer[1],0,0x10);
    glu::CallLogWrapper::glBindVertexArray(this_00,0);
    glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,this->m_xfo[0]);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,this->m_buffer[1]);
    glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,this->m_xfo[1]);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,this->m_buffer[0]);
    glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,0);
    glu::CallLogWrapper::glEnable(this_00,0x8c89);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_po);
    do {
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[uVar7 & 1]);
      glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,this->m_xfo[uVar7 & 1]);
      glu::CallLogWrapper::glBeginTransformFeedback(this_00,0);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
      glu::CallLogWrapper::glEndTransformFeedback(this_00);
      uVar7 = uVar7 + 1;
    } while (uVar7 != 10);
    lVar9 = 0;
    puVar6 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x8c8e,0,0x10,1);
    uVar7 = *puVar6;
    uVar1 = puVar6[1];
    uVar2 = puVar6[2];
    uVar3 = puVar6[3];
    do {
      local_68[lVar9] = 10;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    bVar4 = false;
    if (((uVar7 == local_68[0]) && (bVar4 = false, uVar1 == local_68[1])) && (uVar2 == local_68[2]))
    {
      bVar4 = uVar3 == local_68[3];
    }
    if (bVar4) {
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x8c8e);
    }
    else {
      anon_unknown_0::Output
                ("Data is: %d %d %d %d, data should be: 10 10 10 10.\n",(ulong)*puVar6,
                 (ulong)puVar6[1]);
    }
    lVar9 = -1;
    if ((bVar4) && (bVar4 = RelinkProgram(this,5), bVar4)) {
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[0]);
      glu::CallLogWrapper::glDisableVertexAttribArray(this_00,1);
      uVar7 = 0;
      glu::CallLogWrapper::glBindVertexBuffer(this_00,1,0,0,0);
      glu::CallLogWrapper::glVertexAttribIFormat(this_00,5,4,0x1404,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,5);
      glu::CallLogWrapper::glBindVertexBuffer(this_00,5,this->m_buffer[0],0,0x10);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[1]);
      glu::CallLogWrapper::glDisableVertexAttribArray(this_00,1);
      glu::CallLogWrapper::glBindVertexBuffer(this_00,1,0,0,0);
      glu::CallLogWrapper::glVertexAttribIFormat(this_00,5,4,0x1404,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,5);
      glu::CallLogWrapper::glBindVertexBuffer(this_00,7,this->m_buffer[1],0,0x10);
      glu::CallLogWrapper::glVertexAttribBinding(this_00,5,7);
      glu::CallLogWrapper::glBindVertexArray(this_00,0);
      do {
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[uVar7 & 1]);
        glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,this->m_xfo[uVar7 & 1]);
        glu::CallLogWrapper::glBeginTransformFeedback(this_00,0);
        glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
        glu::CallLogWrapper::glEndTransformFeedback(this_00);
        uVar7 = uVar7 + 1;
      } while (uVar7 != 10);
      lVar8 = 0;
      puVar6 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x8c8e,0,0x10,1);
      uVar7 = *puVar6;
      uVar1 = puVar6[1];
      uVar2 = puVar6[2];
      uVar3 = puVar6[3];
      do {
        local_78[lVar8] = 0x14;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      bVar4 = false;
      if (((uVar7 == local_78[0]) && (bVar4 = false, uVar1 == local_78[1])) &&
         (uVar2 == local_78[2])) {
        bVar4 = uVar3 == local_78[3];
      }
      if (bVar4) {
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x8c8e);
        bVar4 = RelinkProgram(this,0xb);
        if (bVar4) {
          glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,0);
          glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[0]);
          glu::CallLogWrapper::glDisableVertexAttribArray(this_00,5);
          glu::CallLogWrapper::glBindVertexBuffer(this_00,5,0,0,0);
          glu::CallLogWrapper::glVertexAttribIFormat(this_00,0xb,4,0x1404,0);
          glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0xb);
          uVar7 = 1;
          do {
            glu::CallLogWrapper::glBindVertexBuffer
                      (this_00,0xb,this->m_buffer[uVar7 - 1 & 1],0,0x10);
            glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,this->m_buffer[uVar7 & 1]);
            glu::CallLogWrapper::glBeginTransformFeedback(this_00,0);
            glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
            glu::CallLogWrapper::glEndTransformFeedback(this_00);
            uVar7 = uVar7 + 1;
          } while (uVar7 != 0xb);
          lVar9 = 0;
          puVar6 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x8c8e,0,0x10,1);
          uVar7 = *puVar6;
          uVar1 = puVar6[1];
          uVar2 = puVar6[2];
          uVar3 = puVar6[3];
          do {
            local_88[lVar9] = 0x1e;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          bVar4 = false;
          if (((uVar7 == local_88[0]) && (bVar4 = false, uVar1 == local_88[1])) &&
             (uVar2 == local_88[2])) {
            bVar4 = uVar3 == local_88[3];
          }
          if (bVar4 == false) {
            anon_unknown_0::Output
                      ("Data is: %d %d %d %d, data should be: 30 30 30 30.\n",(ulong)*puVar6,
                       (ulong)puVar6[1],(ulong)puVar6[2],(ulong)puVar6[3]);
          }
          lVar9 = (ulong)bVar4 - 1;
        }
      }
      else {
        anon_unknown_0::Output
                  ("Data is: %d %d %d %d, data should be: 20 20 20 20.\n",(ulong)*puVar6,
                   (ulong)puVar6[1]);
      }
    }
  }
  return lVar9;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs = "#version 310 es" NL "in ivec4 vs_in_data;" NL "flat out ivec4 data;" NL
									"void main() {" NL "  data = vs_in_data + 1;" NL "}";
		const char* const glsl_fs =
			"#version 310 es" NL "precision mediump float;" NL "flat in ivec4 data;" NL "out vec4 fs_out_color;" NL
			"void main() {" NL "  fs_out_color = vec4(data);" NL "}";
		m_po = glCreateProgram();
		/* attach shader */
		{
			const GLuint sh  = glCreateShader(GL_VERTEX_SHADER);
			const GLuint fsh = glCreateShader(GL_FRAGMENT_SHADER);
			glShaderSource(sh, 1, &glsl_vs, NULL);
			glShaderSource(fsh, 1, &glsl_fs, NULL);
			glCompileShader(sh);
			glCompileShader(fsh);
			glAttachShader(m_po, sh);
			glAttachShader(m_po, fsh);
			glDeleteShader(sh);
			glDeleteShader(fsh);
		}
		if (!RelinkProgram(1))
			return ERROR;

		glBindBuffer(GL_ARRAY_BUFFER, m_buffer[0]);
		IVec4 zero(0);
		glBufferData(GL_ARRAY_BUFFER, 16, &zero, GL_STATIC_DRAW);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_buffer[1]);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 16, &zero, GL_DYNAMIC_READ);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		glBindVertexArray(m_vao[0]);
		glVertexAttribIFormat(1, 4, GL_INT, 0);
		glEnableVertexAttribArray(1);
		glBindVertexBuffer(1, m_buffer[0], 0, 16);
		glBindVertexArray(m_vao[1]);
		glVertexAttribIFormat(1, 4, GL_INT, 0);
		glEnableVertexAttribArray(1);
		glBindVertexBuffer(1, m_buffer[1], 0, 16);
		glBindVertexArray(0);

		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfo[0]);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer[1]);
		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfo[1]);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer[0]);
		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);

		glEnable(GL_RASTERIZER_DISCARD);
		glUseProgram(m_po);

		for (int i = 0; i < 10; ++i)
		{
			glBindVertexArray(m_vao[i % 2]);
			glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfo[i % 2]);
			glBeginTransformFeedback(GL_POINTS);
			glDrawArrays(GL_POINTS, 0, 1);
			glEndTransformFeedback();
		}
		/* */
		{
			IVec4* data =
				static_cast<IVec4*>(glMapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(IVec4), GL_MAP_READ_BIT));
			if (!IsEqual(*data, IVec4(10)))
			{
				Output("Data is: %d %d %d %d, data should be: 10 10 10 10.\n", (*data)[0], (*data)[1], (*data)[2],
					   (*data)[3]);
				return ERROR;
			}
			glUnmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		}

		if (!RelinkProgram(5))
			return ERROR;
		glBindVertexArray(m_vao[0]);
		glDisableVertexAttribArray(1);
		glBindVertexBuffer(1, 0, 0, 0);
		glVertexAttribIFormat(5, 4, GL_INT, 0);
		glEnableVertexAttribArray(5);
		glBindVertexBuffer(5, m_buffer[0], 0, 16);
		glBindVertexArray(m_vao[1]);
		glDisableVertexAttribArray(1);
		glBindVertexBuffer(1, 0, 0, 0);
		glVertexAttribIFormat(5, 4, GL_INT, 0);
		glEnableVertexAttribArray(5);
		glBindVertexBuffer(7, m_buffer[1], 0, 16);
		glVertexAttribBinding(5, 7);
		glBindVertexArray(0);

		for (int i = 0; i < 10; ++i)
		{
			glBindVertexArray(m_vao[i % 2]);
			glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfo[i % 2]);
			glBeginTransformFeedback(GL_POINTS);
			glDrawArrays(GL_POINTS, 0, 1);
			glEndTransformFeedback();
		}
		/* */
		{
			IVec4* data =
				static_cast<IVec4*>(glMapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(IVec4), GL_MAP_READ_BIT));
			if (!IsEqual(*data, IVec4(20)))
			{
				Output("Data is: %d %d %d %d, data should be: 20 20 20 20.\n", (*data)[0], (*data)[1], (*data)[2],
					   (*data)[3]);
				return ERROR;
			}
			glUnmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		}

		if (!RelinkProgram(11))
			return ERROR;
		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);
		glBindVertexArray(m_vao[0]);
		glDisableVertexAttribArray(5);
		glBindVertexBuffer(5, 0, 0, 0);
		glVertexAttribIFormat(11, 4, GL_INT, 0);
		glEnableVertexAttribArray(11);
		for (int i = 0; i < 10; ++i)
		{
			glBindVertexBuffer(11, m_buffer[i % 2], 0, 16);
			glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer[(i + 1) % 2]);
			glBeginTransformFeedback(GL_POINTS);
			glDrawArrays(GL_POINTS, 0, 1);
			glEndTransformFeedback();
		}
		/* */
		{
			IVec4* data =
				static_cast<IVec4*>(glMapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(IVec4), GL_MAP_READ_BIT));
			if (!IsEqual(*data, IVec4(30)))
			{
				Output("Data is: %d %d %d %d, data should be: 30 30 30 30.\n", (*data)[0], (*data)[1], (*data)[2],
					   (*data)[3]);
				return ERROR;
			}
		}

		return NO_ERROR;
	}